

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O0

void __thiscall
wabt::LexerSourceLineFinder::LexerSourceLineFinder
          (LexerSourceLineFinder *this,
          unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source)

{
  pointer pLVar1;
  int local_30 [6];
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *local_18;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source_local;
  LexerSourceLineFinder *this_local;
  
  local_18 = source;
  source_local = &this->source_;
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::unique_ptr
            (&this->source_,source);
  std::vector<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>::vector
            (&this->line_ranges_);
  this->next_line_start_ = 0;
  this->last_cr_ = false;
  this->eof_ = false;
  pLVar1 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::operator->
                     (&this->source_);
  local_30[2] = (*pLVar1->_vptr_LexerSource[6])(pLVar1,0);
  local_30[1] = 0;
  local_30[0] = 0;
  std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
  emplace_back<int,int>
            ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>> *)
             &this->line_ranges_,local_30 + 1,local_30);
  return;
}

Assistant:

LexerSourceLineFinder::LexerSourceLineFinder(
    std::unique_ptr<LexerSource> source)
    : source_(std::move(source)),
      next_line_start_(0),
      last_cr_(false),
      eof_(false) {
  source_->Seek(0);
  // Line 0 should not be used; but it makes indexing simpler.
  line_ranges_.emplace_back(0, 0);
}